

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O0

float calc_download_speed(http_t *info)

{
  int local_14;
  float speed;
  int diff_time;
  http_t *info_local;
  
  local_14 = (int)info->end_recv_time - (int)info->start_recv_time;
  if (local_14 == 0) {
    local_14 = 1;
  }
  return (float)info->recv_data_len / (float)local_14;
}

Assistant:

float calc_download_speed(http_t *info) {
  int diff_time = 0;
  float speed = 0.0;

  diff_time = info->end_recv_time - info->start_recv_time;
  /* 最小间隔1s，避免计算浮点数结果为inf */
  if (0 == diff_time) diff_time = 1;
  speed = (float)info->recv_data_len / diff_time;

  return speed;
}